

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O1

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::InsideExpression>
          (SampledValueFuncVisitor *this,InsideExpression *expr)

{
  bool bVar1;
  KnownSystemName KVar2;
  Diagnostic *this_00;
  string_view arg;
  long lStack_20;
  
  bVar1 = ClockInference::isSampledValueFuncCall(&expr->super_Expression);
  if (!bVar1) {
    ast::InsideExpression::visitExprs<slang::analysis::SampledValueFuncVisitor&>(expr,this);
    return;
  }
  KVar2 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
  if (KVar2 == Past) {
    if (expr[1].left_ != (Expression *)0x4) goto LAB_00146a2f;
    lStack_20 = 0x18;
  }
  else {
    if (expr[1].left_ != (Expression *)0x2) goto LAB_00146a2f;
    lStack_20 = 8;
  }
  if (**(int **)((long)expr[1].super_Expression.sourceRange.endLoc + lStack_20) != 0x1e) {
    return;
  }
LAB_00146a2f:
  this_00 = AnalysisContext::addDiag
                      (this->context,this->parentSymbol,(DiagCode)0x8000e,
                       (expr->super_Expression).sourceRange);
  arg = ast::CallExpression::getSubroutineName((CallExpression *)expr);
  Diagnostic::operator<<(this_00,arg);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }